

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglPartialUpdateTests.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> *
deqp::egl::anon_unknown_0::getDamageRegion
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Frame *frame,int marginLeft,
          int marginBottom,int marginRight,int marginTop)

{
  ColoredRect *pCVar1;
  int iVar2;
  int iVar3;
  ColoredRect *pCVar4;
  const_reference pvVar5;
  int local_60;
  int local_5c;
  int local_58 [5];
  int local_44;
  ColoredRect *local_40;
  ColoredRect *rect;
  size_t drawNdx;
  int local_28;
  int local_24;
  int marginTop_local;
  int marginRight_local;
  int marginBottom_local;
  int marginLeft_local;
  Frame *frame_local;
  vector<int,_std::allocator<int>_> *damageRegion;
  
  drawNdx._7_1_ = 0;
  local_28 = marginTop;
  local_24 = marginRight;
  marginTop_local = marginBottom;
  marginRight_local = marginLeft;
  _marginBottom_local = frame;
  frame_local = (Frame *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
  for (rect = (ColoredRect *)0x0; pCVar1 = rect,
      pCVar4 = (ColoredRect *)
               std::
               vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
               ::size(&_marginBottom_local->draws), pCVar1 < pCVar4;
      rect = (ColoredRect *)((long)(rect->bottomLeft).m_data + 1)) {
    pvVar5 = std::
             vector<deqp::egl::(anonymous_namespace)::DrawCommand,_std::allocator<deqp::egl::(anonymous_namespace)::DrawCommand>_>
             ::operator[](&_marginBottom_local->draws,(size_type)rect);
    local_40 = &pvVar5->rect;
    local_44 = tcu::Vector<int,_2>::x(&local_40->bottomLeft);
    local_44 = local_44 - marginRight_local;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_44);
    local_58[0] = tcu::Vector<int,_2>::y(&local_40->bottomLeft);
    local_58[0] = local_58[0] - marginTop_local;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,local_58);
    iVar2 = tcu::Vector<int,_2>::x(&local_40->topRight);
    iVar3 = tcu::Vector<int,_2>::x(&local_40->bottomLeft);
    local_5c = (iVar2 - iVar3) + marginRight_local + local_24;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_5c);
    iVar2 = tcu::Vector<int,_2>::y(&local_40->topRight);
    iVar3 = tcu::Vector<int,_2>::y(&local_40->bottomLeft);
    local_60 = (iVar2 - iVar3) + marginTop_local + local_28;
    std::vector<int,_std::allocator<int>_>::push_back(__return_storage_ptr__,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> getDamageRegion (const Frame& frame, int marginLeft, int marginBottom, int marginRight, int marginTop)
{
	vector<EGLint> damageRegion;
	for (size_t drawNdx = 0; drawNdx < frame.draws.size(); drawNdx++)
	{
		const ColoredRect& rect = frame.draws[drawNdx].rect;
		damageRegion.push_back(rect.bottomLeft.x() - marginLeft);
		damageRegion.push_back(rect.bottomLeft.y() - marginBottom);
		damageRegion.push_back(rect.topRight.x() - rect.bottomLeft.x() + marginLeft + marginRight);
		damageRegion.push_back(rect.topRight.y() - rect.bottomLeft.y() + marginBottom + marginTop);
	}

	DE_ASSERT(damageRegion.size() % 4 == 0);
	return damageRegion;
}